

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

MTBDD mtbdd_makemapnode(uint32_t var,MTBDD low,MTBDD high)

{
  long *plVar1;
  FILE *__stream;
  MTBDD MVar2;
  size_t sVar3;
  ulong b;
  long in_FS_OFFSET;
  int created;
  
  if ((long)low < 0) {
    __assert_fail("!MTBDD_HASMARK(low)",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                  ,0x1f5,"MTBDD mtbdd_makemapnode(uint32_t, MTBDD, MTBDD)");
  }
  b = (ulong)var << 0x28 | low;
  MVar2 = llmsset_lookup(nodes,high | 0x1000000000000000,b,&created);
  if (MVar2 == 0) {
    mtbdd_refs_push(low);
    mtbdd_refs_push(high);
    sylvan_gc_RUN();
    plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x28);
    *plVar1 = *plVar1 + -0x10;
    MVar2 = llmsset_lookup(nodes,high | 0x1000000000000000,b,&created);
    __stream = _stderr;
    if (MVar2 == 0) {
      sVar3 = llmsset_count_marked_RUN(nodes);
      fprintf(__stream,"BDD Unique table full, %zu of %zu buckets filled!\n",sVar3,nodes->table_size
             );
      exit(1);
    }
  }
  return MVar2;
}

Assistant:

MTBDD
mtbdd_makemapnode(uint32_t var, MTBDD low, MTBDD high)
{
    struct mtbddnode n;
    uint64_t index;
    int created;

    // in an MTBDDMAP, the low edges eventually lead to 0 and cannot have a low mark
    assert(!MTBDD_HASMARK(low));

    mtbddnode_makemapnode(&n, var, low, high);
    index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        mtbdd_refs_push(low);
        mtbdd_refs_push(high);
        RUN(sylvan_gc);
        mtbdd_refs_pop(2);

        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "BDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(BDD_NODES_CREATED);
    else sylvan_stats_count(BDD_NODES_REUSED);

    return index;
}